

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O0

void __thiscall C3DFile::readPointSection(C3DFile *this,ifstream *datastream)

{
  Sint16 SVar1;
  _Ios_Seekdir _Var2;
  reference pvVar3;
  reference pvVar4;
  undefined1 local_f4 [8];
  FramePointInfo point_info_1;
  FramePointIntInfo int_point_info;
  FramePointInfo point_info;
  uint frame_index;
  vector<FramePointInfo,_std::allocator<FramePointInfo>_> frame_data;
  undefined1 local_a0 [8];
  FloatMarkerData marker_data;
  int i;
  Uint16 frame_count;
  Sint16 point_count;
  int data_start;
  float point_scale;
  ifstream *datastream_local;
  C3DFile *this_local;
  
  _frame_count = getParamFloat(this,"POINT:SCALE");
  if (0.0 <= _frame_count) {
    this->uses_integer_data = true;
  }
  else {
    this->uses_integer_data = false;
    _frame_count = _frame_count * -1.0;
  }
  SVar1 = getParamSint16(this,"POINT:DATA_START");
  _Var2 = (SVar1 + -1) * 0x200;
  if (0x200 < (int)_Var2) {
    std::istream::seekg((long)datastream,_Var2);
    marker_data.residual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_2_ = getParamSint16(this,"POINT:USED");
    marker_data.residual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_2_ =
         ((this->header).last_frame - (this->header).first_frame) + 1;
    for (marker_data.residual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (int)marker_data.residual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage <
        marker_data.residual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_;
        marker_data.residual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)marker_data.residual.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1) {
      FloatMarkerData::FloatMarkerData((FloatMarkerData *)local_a0);
      std::vector<FloatMarkerData,_std::allocator<FloatMarkerData>_>::push_back
                (&this->float_point_data,(FloatMarkerData *)local_a0);
      std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>::vector
                ((vector<FramePointInfo,_std::allocator<FramePointInfo>_> *)&point_info.cameras);
      std::
      vector<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
      ::push_back(&this->point_data,(value_type *)&point_info.cameras);
      std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>::~vector
                ((vector<FramePointInfo,_std::allocator<FramePointInfo>_> *)&point_info.cameras);
      FloatMarkerData::~FloatMarkerData((FloatMarkerData *)local_a0);
    }
    for (point_info.z = 0.0;
        (uint)point_info.z <
        (uint)marker_data.residual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_;
        point_info.z = (float)((int)point_info.z + 1)) {
      for (marker_data.residual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          (int)marker_data.residual.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage <
          marker_data.residual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_;
          marker_data.residual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               (int)marker_data.residual.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 1) {
        if ((this->uses_integer_data & 1U) == 0) {
          std::istream::read((char *)datastream,(long)&int_point_info);
          pvVar3 = std::vector<FloatMarkerData,_std::allocator<FloatMarkerData>_>::operator[]
                             (&this->float_point_data,
                              (long)(int)marker_data.residual.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<float,_std::allocator<float>_>::push_back
                    (&pvVar3->x,(value_type_conflict *)&int_point_info);
          pvVar3 = std::vector<FloatMarkerData,_std::allocator<FloatMarkerData>_>::operator[]
                             (&this->float_point_data,
                              (long)(int)marker_data.residual.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<float,_std::allocator<float>_>::push_back
                    (&pvVar3->y,(value_type_conflict *)&int_point_info.z);
          pvVar3 = std::vector<FloatMarkerData,_std::allocator<FloatMarkerData>_>::operator[]
                             (&this->float_point_data,
                              (long)(int)marker_data.residual.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<float,_std::allocator<float>_>::push_back(&pvVar3->z,&point_info.x);
          pvVar3 = std::vector<FloatMarkerData,_std::allocator<FloatMarkerData>_>::operator[]
                             (&this->float_point_data,
                              (long)(int)marker_data.residual.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    (&pvVar3->cameras,(value_type_conflict2 *)&point_info.y);
          pvVar3 = std::vector<FloatMarkerData,_std::allocator<FloatMarkerData>_>::operator[]
                             (&this->float_point_data,
                              (long)(int)marker_data.residual.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    (&pvVar3->residual,(value_type_conflict2 *)((long)&point_info.y + 1));
          pvVar4 = std::
                   vector<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
                   ::at(&this->point_data,
                        (long)(int)marker_data.residual.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>::push_back
                    (pvVar4,(value_type *)&int_point_info);
        }
        else {
          std::istream::read((char *)datastream,(long)&point_info_1.z);
          local_f4._0_4_ = _frame_count * (float)(int)point_info_1.z._0_2_;
          local_f4._4_4_ = _frame_count * (float)(int)point_info_1.z._2_2_;
          point_info_1.x = _frame_count * (float)(int)(short)point_info_1._12_2_;
          point_info_1.y._0_1_ = point_info_1._14_1_;
          point_info_1.y._1_1_ = point_info_1._15_1_;
          pvVar3 = std::vector<FloatMarkerData,_std::allocator<FloatMarkerData>_>::operator[]
                             (&this->float_point_data,
                              (long)(int)marker_data.residual.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<float,_std::allocator<float>_>::push_back
                    (&pvVar3->x,(value_type_conflict *)local_f4);
          pvVar3 = std::vector<FloatMarkerData,_std::allocator<FloatMarkerData>_>::operator[]
                             (&this->float_point_data,
                              (long)(int)marker_data.residual.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<float,_std::allocator<float>_>::push_back
                    (&pvVar3->y,(value_type_conflict *)(local_f4 + 4));
          pvVar3 = std::vector<FloatMarkerData,_std::allocator<FloatMarkerData>_>::operator[]
                             (&this->float_point_data,
                              (long)(int)marker_data.residual.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<float,_std::allocator<float>_>::push_back(&pvVar3->z,&point_info_1.x);
          pvVar3 = std::vector<FloatMarkerData,_std::allocator<FloatMarkerData>_>::operator[]
                             (&this->float_point_data,
                              (long)(int)marker_data.residual.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    (&pvVar3->cameras,(value_type_conflict2 *)&point_info_1.y);
          pvVar3 = std::vector<FloatMarkerData,_std::allocator<FloatMarkerData>_>::operator[]
                             (&this->float_point_data,
                              (long)(int)marker_data.residual.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    (&pvVar3->residual,(value_type_conflict2 *)((long)&point_info_1.y + 1));
          pvVar4 = std::
                   vector<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
                   ::at(&this->point_data,
                        (long)(int)marker_data.residual.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>::push_back
                    (pvVar4,(value_type *)local_f4);
        }
      }
      std::istream::seekg((long)datastream,(uint)(this->header).analog_channels << 2);
    }
    return;
  }
  __assert_fail("data_start > 512",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                ,0x12f,"void C3DFile::readPointSection(ifstream &)");
}

Assistant:

void C3DFile::readPointSection(ifstream &datastream) {
	float point_scale = getParamFloat("POINT:SCALE");

	//Check point scale value to figure out if the data is stored in integer or floating point format
	//if point_scale is negative the floating point format is used, other wise the integer format
	if (point_scale < 0.) {
		uses_integer_data = false;
		point_scale *= -1.;
	} else {
		uses_integer_data = true;
	}

	// compute the start of the point data
	int data_start = getParamSint16 ("POINT:DATA_START");
	data_start = 512 * ( data_start - 1);
		
	assert (data_start > 512);

	datastream.seekg(data_start, ios::beg);

	Sint16 point_count = getParamSint16("POINT:USED");

	Uint16 frame_count = header.last_frame - header.first_frame + 1;

	/*
	float video_frame_rate = header.video_sampling_rate;
	float analog_frame_rate = header.video_sampling_rate * header.analog_channels_samples;
	Uint16 analog_channel_count = header.analog_channels;

	cout << endl;
	cout << "Frame Count       = " << frame_count << endl;
	cout << "Video Frame Rate  = " << video_frame_rate << endl;
	cout << "Analog Frame Rate = " << analog_frame_rate << endl;
	cout << "Analog channels   = " << analog_channel_count / header.analog_channels_samples << endl;
	cout << endl;
	*/

	// Populate point_data
	int i;
	for (i = 0; i < point_count; i++) {
		FloatMarkerData marker_data;
		float_point_data.push_back(marker_data);
		std::vector<FramePointInfo> frame_data;
		point_data.push_back(frame_data);
	}

	unsigned int frame_index;

	for (frame_index = 0; frame_index < frame_count; frame_index ++) {
		// Read the frames
		for (i = 0; i < point_count; i++) {
			//read data from float data section
			if (!uses_integer_data) {
				FramePointInfo point_info;
				datastream.read(reinterpret_cast<char *>(&point_info), sizeof(FramePointInfo));

				float_point_data[i].x.push_back(point_info.x);
				float_point_data[i].y.push_back(point_info.y);
				float_point_data[i].z.push_back(point_info.z);

			    float_point_data[i].cameras.push_back(point_info.cameras);
			    float_point_data[i].residual.push_back(point_info.residual);

				point_data.at(i).push_back(point_info);
			//read data from int data section
			} else {
				FramePointIntInfo int_point_info;
				datastream.read(reinterpret_cast<char *>(&int_point_info), sizeof(FramePointIntInfo));

				FramePointInfo point_info;
				point_info.x = point_scale * int_point_info.x;
				point_info.y = point_scale * int_point_info.y;
				point_info.z = point_scale * int_point_info.z;
				point_info.cameras = int_point_info.cameras;
				point_info.residual = int_point_info.residual;

				float_point_data[i].x.push_back(point_info.x);
				float_point_data[i].y.push_back(point_info.y);
				float_point_data[i].z.push_back(point_info.z);

			    float_point_data[i].cameras.push_back(point_info.cameras);
			    float_point_data[i].residual.push_back(point_info.residual);

				point_data.at(i).push_back(point_info);
			}
		}

		datastream.seekg((header.analog_channels) * sizeof(float), ios::cur);
	}
}